

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

void handle_getstring(BinarySource *in,strbuf *out)

{
  byte val;
  strbuf *psVar1;
  ulong uStack_28;
  char c;
  size_t i;
  strbuf *sb;
  strbuf *out_local;
  BinarySource *in_local;
  
  psVar1 = get_val_string(in);
  for (uStack_28 = 0; uStack_28 < psVar1->len; uStack_28 = uStack_28 + 1) {
    val = psVar1->s[uStack_28];
    if ((((char)val < '!') || ('~' < (char)val)) || (val == 0x25)) {
      BinarySink_put_fmt(out->binarysink_,"%%%02X",(ulong)val);
    }
    else {
      BinarySink_put_byte(out->binarysink_,val);
    }
  }
  BinarySink_put_byte(out->binarysink_,'\n');
  return;
}

Assistant:

static void handle_getstring(BinarySource *in, strbuf *out)
{
    strbuf *sb = get_val_string(in);
    for (size_t i = 0; i < sb->len; i++) {
        char c = sb->s[i];
        if (c > ' ' && c < 0x7F && c != '%') {
            put_byte(out, c);
        } else {
            put_fmt(out, "%%%02X", 0xFFU & (unsigned)c);
        }
    }
    put_byte(out, '\n');
}